

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int ARKodeGetNumMassSolves(void *arkode_mem,long *nmsolves)

{
  long lVar1;
  int iVar2;
  
  if (arkode_mem == (void *)0x0) {
    iVar2 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x7c6,"ARKodeGetNumMassSolves",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    if (*(int *)((long)arkode_mem + 0x200) == 0) {
      *nmsolves = 0;
    }
    else {
      lVar1 = (**(code **)((long)arkode_mem + 0x218))(arkode_mem);
      if (lVar1 == 0) {
        arkProcessError((ARKodeMem)arkode_mem,-6,0x101d,"ARKodeGetNumMassSolves",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"Mass matrix solver memory is NULL.");
        return -6;
      }
      *nmsolves = *(long *)(lVar1 + 0x50);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ARKodeGetNumMassSolves(void* arkode_mem, long int* nmsolves)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Return 0 for incompatible steppers */
  if (!ark_mem->step_supports_massmatrix)
  {
    *nmsolves = 0;
    return (ARK_SUCCESS);
  }

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set output and return */
  *nmsolves = arkls_mem->nmsolves;
  return (ARKLS_SUCCESS);
}